

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O0

int64_t __thiscall node::anon_unknown_2::NodeImpl::getLastBlockTime(NodeImpl *this)

{
  long lVar1;
  CBlockIndex *pCVar2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_RDI;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock24;
  ChainstateManager *in_stack_ffffffffffffff78;
  CChain *in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  AnnotatedMixin<std::recursive_mutex> *in_stack_ffffffffffffffb0;
  undefined8 local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffff78);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_RDI,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
             (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffff98 >> 0x18,0));
  chainman((NodeImpl *)in_stack_ffffffffffffff78);
  ChainstateManager::ActiveChain(in_stack_ffffffffffffff78);
  pCVar2 = CChain::Tip(in_stack_ffffffffffffff88);
  if (pCVar2 == (CBlockIndex *)0x0) {
    chainman((NodeImpl *)in_stack_ffffffffffffff78);
    ChainstateManager::GetParams(in_stack_ffffffffffffff78);
    CChainParams::GenesisBlock((CChainParams *)in_stack_ffffffffffffff78);
    local_20 = CBlockHeader::GetBlockTime((CBlockHeader *)in_stack_ffffffffffffff78);
  }
  else {
    chainman((NodeImpl *)in_stack_ffffffffffffff78);
    ChainstateManager::ActiveChain(in_stack_ffffffffffffff78);
    CChain::Tip(in_stack_ffffffffffffff88);
    local_20 = CBlockIndex::GetBlockTime((CBlockIndex *)in_stack_ffffffffffffff78);
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff78);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_20;
  }
  __stack_chk_fail();
}

Assistant:

int64_t getLastBlockTime() override
    {
        LOCK(::cs_main);
        if (chainman().ActiveChain().Tip()) {
            return chainman().ActiveChain().Tip()->GetBlockTime();
        }
        return chainman().GetParams().GenesisBlock().GetBlockTime(); // Genesis block's time of current network
    }